

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_llp.c
# Opt level: O1

void gga_k_llp_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long extraout_RDX;
  long lVar9;
  long in_RSI;
  long *plVar10;
  long *in_R8;
  ulong uVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined8 uVar18;
  undefined1 auVar17 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double __x;
  double dVar22;
  double dVar23;
  
  plVar10 = (long *)0x10;
  puVar5 = (undefined8 *)malloc(0x10);
  p->params = puVar5;
  uVar3 = p->info->number;
  uVar7 = (ulong)uVar3;
  if (uVar3 == 0x20a) {
    uVar12 = 0x3f70d78ad1fc4845;
    uVar18 = 0x40189caf44c46994;
  }
  else {
    if (uVar3 != 0x202) {
      gga_k_llp_init_cold_1();
      if (in_RSI != 0) {
        lVar9 = 0;
        do {
          if ((int)plVar10[1] == 2) {
            lVar6 = (int)plVar10[9] * lVar9;
            dVar13 = *(double *)(extraout_RDX + lVar6 * 8) +
                     *(double *)(extraout_RDX + 8 + lVar6 * 8);
          }
          else {
            dVar13 = *(double *)(extraout_RDX + (int)plVar10[9] * lVar9 * 8);
          }
          dVar20 = (double)plVar10[0x30];
          if (dVar20 <= dVar13) {
            dVar13 = *(double *)(extraout_RDX + (int)plVar10[9] * lVar9 * 8);
            if (dVar13 <= dVar20) {
              dVar13 = dVar20;
            }
            dVar19 = (double)plVar10[0x32] * (double)plVar10[0x32];
            __x = *(double *)(uVar7 + *(int *)((long)plVar10 + 0x4c) * lVar9 * 8);
            if (__x <= dVar19) {
              __x = dVar19;
            }
            pdVar4 = (double *)plVar10[0x2f];
            dVar19 = (double)plVar10[0x31];
            dVar14 = cbrt(dVar13);
            dVar1 = *pdVar4;
            dVar2 = pdVar4[1];
            if (__x < 0.0) {
              dVar23 = sqrt(__x);
            }
            else {
              dVar23 = SQRT(__x);
            }
            dVar15 = (1.0 / dVar14) / dVar13;
            dVar22 = dVar23 * 1.2599210498948732 * dVar15;
            dVar16 = dVar22 * dVar22 + 1.0;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            dVar16 = log(dVar22 + dVar16);
            dVar22 = 0.0;
            if (dVar20 < dVar13 * 0.5) {
              dVar20 = (double)(-(ulong)(dVar19 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar19 < 1.0) & (ulong)(dVar19 + -1.0 + 1.0));
              uVar11 = -(ulong)(dVar20 <= dVar19);
              dVar20 = (double)(uVar11 & (ulong)dVar19 | ~uVar11 & (ulong)dVar20);
              dVar19 = cbrt(dVar20);
              dVar22 = cbrt(0.3183098861837907);
              auVar21._0_8_ = dVar14 * dVar14;
              auVar21._8_8_ = dVar15 * 1.2599210498948732 * dVar16 * dVar2 * dVar1 * dVar23 + 1.0;
              auVar17 = divpd(_DAT_0103b460,auVar21);
              dVar22 = dVar19 * dVar19 * dVar20 * auVar21._0_8_ * 1.4356170000940958 *
                       (auVar17._8_8_ * (auVar17._0_8_ / (dVar13 * dVar13)) *
                        __x * 1.5874010519681996 *
                        (1.0 / dVar22) * 1.5874010519681996 * dVar1 * 2.080083823051904 *
                        0.2222222222222222 + 1.0);
              dVar22 = dVar22 + dVar22;
            }
            lVar6 = *in_R8;
            if ((lVar6 != 0) && ((*(byte *)(*plVar10 + 0x40) & 1) != 0)) {
              lVar8 = (int)plVar10[0xb] * lVar9;
              *(double *)(lVar6 + lVar8 * 8) = dVar22 + *(double *)(lVar6 + lVar8 * 8);
            }
          }
          lVar9 = lVar9 + 1;
        } while (in_RSI != lVar9);
      }
      return;
    }
    uVar12 = 0x3f718470ead02c36;
    uVar18 = 0x4019f1fc9ad2b51c;
  }
  *puVar5 = uVar12;
  puVar5[1] = uVar18;
  return;
}

Assistant:

static void
gga_k_llp_init(xc_func_type *p)
{
  gga_k_llp_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_llp_params));
  params = (gga_k_llp_params *) (p->params);

  /* value of beta in standard Becke 88 functional */
  switch(p->info->number){
  case XC_GGA_K_LLP:
    params->beta  = X_FACTOR_C*0.0044188;
    params->gamma = 0.0253/(X_FACTOR_C*0.0044188);
    break;
  case XC_GGA_K_FR_B88:
    params->beta  = X_FACTOR_C*0.004596;
    params->gamma = 0.02774/(X_FACTOR_C*0.004596);
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_llp\n");
    exit(1);
  }
}